

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int aec_decode_init(aec_stream_conflict *strm)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  internal_state_conflict *piVar4;
  code *pcVar5;
  _func_int_aec_stream_ptr_conflict **pp_Var6;
  ulong uVar7;
  uint32_t *puVar8;
  int iVar9;
  uint uVar10;
  int i;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint32_t uVar18;
  
  uVar1 = strm->bits_per_sample;
  iVar13 = -1;
  if (0xffffffdf < uVar1 - 0x21) {
    iVar13 = 1;
    piVar4 = (internal_state_conflict *)calloc(1,0x358);
    if (piVar4 == (internal_state_conflict *)0x0) {
      iVar13 = -4;
    }
    else {
      iVar2 = 2;
      iVar9 = 1;
      iVar14 = 0;
      for (iVar11 = 0; iVar11 != 0xd; iVar11 = iVar11 + 1) {
        iVar15 = iVar13 + iVar14;
        for (lVar16 = (long)iVar14; iVar9 != lVar16; lVar16 = lVar16 + 1) {
          piVar4->se_table[lVar16 * 2] = iVar11;
          piVar4->se_table[lVar16 * 2 + 1] = iVar14;
        }
        iVar13 = iVar13 + 1;
        iVar9 = iVar9 + iVar2;
        iVar2 = iVar2 + 1;
        iVar14 = iVar15;
      }
      strm->state = piVar4;
      if (uVar1 < 0x11) {
        if (uVar1 < 9) {
          uVar12 = strm->flags;
          if ((uVar12 & 0x10) == 0) {
            piVar4->id_len = 3;
            iVar13 = 3;
          }
          else {
            if (4 < uVar1) {
              return -1;
            }
            if (uVar1 < 3) {
              piVar4->id_len = 1;
              iVar13 = 1;
            }
            else {
              piVar4->id_len = 2;
              iVar13 = 2;
            }
          }
          piVar4->bytes_per_sample = 1;
          uVar18 = strm->block_size;
          piVar4->out_blklen = uVar18;
          piVar4->flush_output = flush_8;
        }
        else {
          piVar4->bytes_per_sample = 2;
          piVar4->id_len = 4;
          uVar18 = strm->block_size;
          piVar4->out_blklen = uVar18 * 2;
          uVar12 = strm->flags;
          if ((uVar12 & 4) == 0) {
            pcVar5 = flush_lsb_16;
          }
          else {
            pcVar5 = flush_msb_16;
          }
          piVar4->flush_output = pcVar5;
          iVar13 = 4;
        }
      }
      else {
        piVar4->id_len = 5;
        uVar12 = strm->flags;
        if ((uVar12 & 2) == 0 || 0x18 < uVar1) {
          piVar4->bytes_per_sample = 4;
          pcVar5 = flush_msb_32;
          if ((uVar12 & 4) == 0) {
            pcVar5 = flush_lsb_32;
          }
          iVar13 = 4;
        }
        else {
          piVar4->bytes_per_sample = 3;
          pcVar5 = flush_msb_24;
          if ((uVar12 & 4) == 0) {
            pcVar5 = flush_lsb_24;
          }
          iVar13 = 3;
        }
        piVar4->flush_output = pcVar5;
        uVar18 = strm->block_size;
        piVar4->out_blklen = iVar13 * uVar18;
        iVar13 = 5;
      }
      if ((uVar12 & 1) == 0) {
        uVar3 = 0xffffffff >> (-(char)uVar1 & 0x1fU);
        uVar10 = 0;
      }
      else {
        uVar3 = 0xffffffff >> (0x21U - (char)uVar1 & 0x1f);
        uVar10 = ~uVar3;
      }
      piVar4->xmin = uVar10;
      piVar4->xmax = uVar3;
      piVar4->in_blklen = (uVar1 * uVar18 + iVar13 >> 3) + 9;
      pp_Var6 = (_func_int_aec_stream_ptr_conflict **)
                malloc((ulong)(0x100000000 << (sbyte)iVar13) >> 0x1d);
      piVar4->id_table = pp_Var6;
      if (pp_Var6 == (_func_int_aec_stream_ptr_conflict **)0x0) {
        iVar13 = -4;
      }
      else {
        *pp_Var6 = m_low_entropy;
        uVar17 = (ulong)((1 << (sbyte)iVar13) - 1);
        for (uVar7 = 1; uVar7 < uVar17; uVar7 = uVar7 + 1) {
          piVar4->id_table[uVar7] = m_split;
        }
        piVar4->id_table[uVar17] = m_uncomp;
        uVar7 = (ulong)(uVar18 * strm->rsi);
        piVar4->rsi_size = uVar7;
        puVar8 = (uint32_t *)malloc(uVar7 << 2);
        piVar4->rsi_buffer = puVar8;
        iVar13 = -4;
        if (puVar8 != (uint32_t *)0x0) {
          piVar4->ref = 0;
          strm->total_in = 0;
          strm->total_out = 0;
          piVar4->rsip = puVar8;
          piVar4->flush_start = puVar8;
          piVar4->bitp = 0;
          piVar4->fs = 0;
          piVar4->pp = uVar12 & 8;
          piVar4->mode = m_id;
          iVar13 = 0;
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    int i, modi;
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size
            * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample + 1);
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample);
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 9;

    modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    state->mode = m_id;
    return AEC_OK;
}